

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvbios.c
# Opt level: O3

int usage(char *name)

{
  printf("Usage: %s mybios.rom [-c XX] [-s strap]\n",name);
  puts("Options:");
  puts("  -c XX : override card generation");
  puts("  -m XX : set tCWL (for timing entry size < 20)");
  puts("  -s XX : set the trap register");
  puts("  -i XXXX : print init script at XXXX and exit");
  return 1;
}

Assistant:

int usage(char* name) {
	printf("Usage: %s mybios.rom [-c XX] [-s strap]\n",name);
	printf("Options:\n");
	printf("  -c XX : override card generation\n");
	printf("  -m XX : set tCWL (for timing entry size < 20)\n");
	printf("  -s XX : set the trap register\n");
	printf("  -i XXXX : print init script at XXXX and exit\n");
	return 1;
}